

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionarySGL.hpp
# Opt level: O0

void __thiscall
ddd::DictionarySGL<true,_false>::enumerate
          (DictionarySGL<true,_false> *this,vector<ddd::KvPair,_std::allocator<ddd::KvPair>_> *kvs)

{
  bool bVar1;
  vector<ddd::KvPair,_std::allocator<ddd::KvPair>_> *in_stack_00000038;
  string *in_stack_00000040;
  string local_30 [8];
  size_type in_stack_ffffffffffffffd8;
  vector<ddd::KvPair,_std::allocator<ddd::KvPair>_> *in_stack_ffffffffffffffe0;
  
  std::vector<ddd::KvPair,_std::allocator<ddd::KvPair>_>::clear
            ((vector<ddd::KvPair,_std::allocator<ddd::KvPair>_> *)0x16d732);
  std::
  unique_ptr<ddd::DaTrie<true,_false,_false>,_std::default_delete<ddd::DaTrie<true,_false,_false>_>_>
  ::operator->((unique_ptr<ddd::DaTrie<true,_false,_false>,_std::default_delete<ddd::DaTrie<true,_false,_false>_>_>
                *)0x16d740);
  bVar1 = DaTrie<true,_false,_false>::is_empty((DaTrie<true,_false,_false> *)0x16d748);
  if (!bVar1) {
    std::vector<ddd::KvPair,_std::allocator<ddd::KvPair>_>::reserve
              (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
    std::
    unique_ptr<ddd::DaTrie<true,_false,_false>,_std::default_delete<ddd::DaTrie<true,_false,_false>_>_>
    ::operator->((unique_ptr<ddd::DaTrie<true,_false,_false>,_std::default_delete<ddd::DaTrie<true,_false,_false>_>_>
                  *)0x16d771);
    std::__cxx11::string::string(local_30);
    DaTrie<true,_false,_false>::enumerate
              ((DaTrie<true,_false,_false> *)this,kvs._4_4_,in_stack_00000040,in_stack_00000038);
    std::__cxx11::string::~string(local_30);
  }
  return;
}

Assistant:

void enumerate(std::vector<KvPair>& kvs) const {
    kvs.clear();
    if (trie_->is_empty()) {
      return;
    }
    kvs.reserve(num_keys_);
    trie_->enumerate(ROOT_POS, std::string(), kvs);
  }